

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_buffer.c
# Opt level: O1

int lj_cf_buffer_decode(lua_State *L)

{
  TValue *pTVar1;
  uint64_t uVar2;
  GCstr *str;
  
  str = lj_lib_checkstrx(L,1);
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  pTVar1->u64 = 0xffffffffffffffff;
  lj_serialize_decode(L,L->top + -1,str);
  uVar2 = (L->glref).ptr64;
  if (*(ulong *)(uVar2 + 0x18) <= *(ulong *)(uVar2 + 0x10)) {
    lj_gc_step(L);
  }
  return 1;
}

Assistant:

LJLIB_CF(buffer_decode)			LJLIB_REC(.)
{
  GCstr *str = lj_lib_checkstrx(L, 1);
  setnilV(L->top++);
  lj_serialize_decode(L, L->top-1, str);
  lj_gc_check(L);
  return 1;
}